

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_uv_area_report(REF_GRID ref_grid)

{
  REF_GEOM ref_geom_00;
  REF_CELL ref_cell_00;
  REF_STATUS RVar1;
  uint uVar2;
  REF_DBL local_100;
  REF_DBL local_f8;
  REF_INT local_f0;
  REF_INT local_ec;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT n_pos;
  REF_INT n_neg;
  REF_DBL sign_uv_area;
  REF_DBL max_uv_area;
  REF_DBL min_uv_area;
  REF_DBL total_uv_area;
  REF_DBL uv_area;
  REF_INT local_a8;
  REF_BOOL no_cell;
  REF_INT nodes [27];
  REF_INT cell;
  REF_INT max_id;
  REF_INT min_id;
  REF_INT id;
  REF_INT geom;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_GRID ref_grid_local;
  
  ref_geom_00 = ref_grid->geom;
  ref_cell_00 = ref_grid->cell[3];
  cell = 0x7fffffff;
  nodes[0x1a] = -0x80000000;
  for (min_id = 0; min_id < ref_geom_00->max; min_id = min_id + 1) {
    if (ref_geom_00->descr[min_id * 6] == 2) {
      if (cell < ref_geom_00->descr[min_id * 6 + 1]) {
        local_ec = cell;
      }
      else {
        local_ec = ref_geom_00->descr[min_id * 6 + 1];
      }
      cell = local_ec;
      if (ref_geom_00->descr[min_id * 6 + 1] < nodes[0x1a]) {
        local_f0 = nodes[0x1a];
      }
      else {
        local_f0 = ref_geom_00->descr[min_id * 6 + 1];
      }
      nodes[0x1a] = local_f0;
    }
  }
  max_id = cell;
  do {
    if (nodes[0x1a] < max_id) {
      return 0;
    }
    uv_area._4_4_ = 1;
    min_uv_area = 0.0;
    max_uv_area = 0.0;
    sign_uv_area = 0.0;
    ref_private_macro_code_rss = 0;
    ref_private_macro_code_rss_1 = 0;
    for (nodes[0x19] = 0; nodes[0x19] < ref_cell_00->max; nodes[0x19] = nodes[0x19] + 1) {
      RVar1 = ref_cell_nodes(ref_cell_00,nodes[0x19],&local_a8);
      if ((RVar1 == 0) && (max_id == nodes[1])) {
        uVar2 = ref_geom_uv_area(ref_geom_00,&local_a8,&total_uv_area);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x14b,"ref_geom_uv_area_report",(ulong)uVar2,"uv area");
          return uVar2;
        }
        min_uv_area = total_uv_area + min_uv_area;
        if (uv_area._4_4_ == 0) {
          if (total_uv_area <= max_uv_area) {
            local_f8 = total_uv_area;
          }
          else {
            local_f8 = max_uv_area;
          }
          max_uv_area = local_f8;
          if (sign_uv_area <= total_uv_area) {
            local_100 = total_uv_area;
          }
          else {
            local_100 = sign_uv_area;
          }
          sign_uv_area = local_100;
        }
        else {
          max_uv_area = total_uv_area;
          sign_uv_area = total_uv_area;
          uv_area._4_4_ = 0;
        }
        if (0.0 <= total_uv_area) {
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1;
        }
        else {
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1;
        }
      }
    }
    if (uv_area._4_4_ == 0) {
      uVar2 = ref_geom_uv_area_sign(ref_grid,max_id,(REF_DBL *)&n_pos);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x15d,"ref_geom_uv_area_report",(ulong)uVar2,"sign");
        return uVar2;
      }
      printf("face%5d: %4.1f %9.2e total (%10.3e,%10.3e) %d + %d -\n",_n_pos,min_uv_area,max_uv_area
             ,sign_uv_area,(ulong)(uint)max_id,(ulong)(uint)ref_private_macro_code_rss_1,
             (ulong)(uint)ref_private_macro_code_rss);
    }
    max_id = max_id + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_geom_uv_area_report(REF_GRID ref_grid) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT geom, id, min_id, max_id;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL no_cell;
  REF_DBL uv_area, total_uv_area, min_uv_area, max_uv_area, sign_uv_area;
  REF_INT n_neg, n_pos;

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_face(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++) {
    no_cell = REF_TRUE;
    total_uv_area = 0.0;
    min_uv_area = 0.0;
    max_uv_area = 0.0;
    n_neg = 0;
    n_pos = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (id == nodes[3]) {
        RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
        total_uv_area += uv_area;
        if (no_cell) {
          min_uv_area = uv_area;
          max_uv_area = uv_area;
          no_cell = REF_FALSE;
        } else {
          min_uv_area = MIN(min_uv_area, uv_area);
          max_uv_area = MAX(max_uv_area, uv_area);
        }
        if (uv_area < 0.0) {
          n_neg++;
        } else {
          n_pos++;
        }
      }
    }
    if (!no_cell) {
      RSS(ref_geom_uv_area_sign(ref_grid, id, &sign_uv_area), "sign");
      printf("face%5d: %4.1f %9.2e total (%10.3e,%10.3e) %d + %d -\n", id,
             sign_uv_area, total_uv_area, min_uv_area, max_uv_area, n_pos,
             n_neg);
    }
  }

  return REF_SUCCESS;
}